

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRenderRule * __thiscall QRenderRule::borderClip(QRenderRule *this,QRect r)

{
  int *piVar1;
  QStyleSheetBorderData *pQVar2;
  int iVar3;
  undefined1 auVar4 [12];
  int iVar5;
  int iVar6;
  long lVar7;
  undefined8 in_RCX;
  long lVar8;
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  int iVar12;
  double dVar11;
  double dVar13;
  double dVar14;
  undefined8 uVar16;
  undefined1 auVar15 [16];
  QSize brr;
  QSize blr;
  QSize trr;
  QSize tlr;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QSize local_78;
  QSize local_70;
  QSize local_68;
  QSize local_60;
  QRect local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  long local_20;
  
  local_58._0_8_ = r._8_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = *(int **)(r._0_8_ + 0x48);
  if (piVar1 == (int *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QPainterPath::QPainterPath((QPainterPath *)this);
      return this;
    }
    goto LAB_00357e35;
  }
  this_00 = (QSharedDataPointer<QStyleSheetBorderData> *)(r._0_8_ + 0x48);
  local_60.wd.m_i = -1;
  local_60.ht.m_i = -1;
  local_68.wd.m_i = -1;
  local_68.ht.m_i = -1;
  local_70.wd.m_i = -1;
  local_70.ht.m_i = -1;
  local_78.wd.m_i = -1;
  local_78.ht.m_i = -1;
  local_58._8_8_ = in_RCX;
  if (*piVar1 != 1) {
    QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_00);
  }
  qNormalizeRadii(&local_58,((this_00->d).ptr)->radii,&local_60,&local_68,&local_70,&local_78);
  if (local_60.ht.m_i == 0 && local_60.wd.m_i == 0) {
    if (local_68.ht.m_i != 0 || local_68.wd.m_i != 0) goto LAB_00357a4d;
    if (local_70.ht.m_i != 0 || local_70.wd.m_i != 0) goto LAB_00357a4d;
    if (local_78.ht.m_i != 0 || local_78.wd.m_i != 0) goto LAB_00357a4d;
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else {
LAB_00357a4d:
    lVar7 = (long)local_58.x1.m_i;
    dVar9 = (double)local_58.x1.m_i;
    lVar8 = (long)local_58.y1.m_i;
    dVar10 = (double)local_58.y1.m_i;
    pQVar2 = (this_00->d).ptr;
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    dVar13 = (double)pQVar2->borders[0] * 0.5 + dVar10;
    local_48 = (double)local_60.wd.m_i + dVar9;
    dStack_40 = dVar13;
    QPainterPath::moveTo((QPointF *)this);
    dVar14 = (double)((local_58.x2.m_i - lVar7) + 1) + dVar9;
    local_48 = dVar14 - (double)local_68.wd.m_i;
    dStack_40 = dVar13;
    QPainterPath::lineTo((QPointF *)this);
    iVar12 = (int)((ulong)*(undefined8 *)pQVar2->borders >> 0x20);
    local_48 = (double)iVar12;
    iVar3 = local_68.wd.m_i.m_i * 2;
    local_38 = (double)(iVar3 - iVar12);
    dStack_30 = (double)(local_68.ht.m_i.m_i * 2 - (int)*(undefined8 *)pQVar2->borders);
    dVar11 = (double)((local_58.y2.m_i - lVar8) + 1) + dVar10;
    dVar14 = dVar14 - local_48 * 0.5;
    local_48 = (dVar14 - (double)iVar3) + local_48;
    dStack_40 = dVar13;
    QPainterPath::arcTo((QRectF *)this,90.0,-90.0);
    dStack_40 = dVar11 - (double)local_78.ht.m_i;
    local_48 = dVar14;
    QPainterPath::lineTo((QPointF *)this);
    iVar3 = (int)*(undefined8 *)(pQVar2->borders + 1);
    iVar12 = (int)((ulong)*(undefined8 *)(pQVar2->borders + 1) >> 0x20);
    dStack_40 = (double)iVar12;
    dVar13 = dVar11 - dStack_40 * 0.5;
    iVar5 = local_78.wd.m_i.m_i * 2;
    iVar6 = local_78.ht.m_i.m_i * 2;
    local_48 = (dVar14 - (double)iVar5) + (double)iVar3;
    dStack_40 = (dVar13 - (double)iVar6) + dStack_40;
    local_38 = (double)(iVar5 - iVar3);
    dStack_30 = (double)(iVar6 - iVar12);
    QPainterPath::arcTo((QRectF *)this,0.0,-90.0);
    local_48 = (double)local_70.wd.m_i + dVar9;
    dStack_40 = dVar13;
    QPainterPath::lineTo((QPointF *)this);
    iVar3 = (int)*(undefined8 *)(pQVar2->borders + 2);
    iVar12 = (int)((ulong)*(undefined8 *)(pQVar2->borders + 2) >> 0x20);
    iVar5 = local_70.ht.m_i.m_i * 2;
    dVar11 = (dVar11 - (double)iVar5) + (double)iVar3 * 0.5;
    dVar9 = dVar9 + (double)iVar12 * 0.5;
    uVar16 = 0;
    local_38 = (double)(local_70.wd.m_i.m_i * 2 - iVar12);
    dStack_30 = (double)(iVar5 - iVar3);
    local_48 = dVar9;
    dStack_40 = dVar11;
    QPainterPath::arcTo((QRectF *)this,270.0,-90.0);
    dStack_40 = (double)local_60.ht.m_i + dVar10;
    QPainterPath::lineTo((QPointF *)this);
    dStack_40 = (double)pQVar2->borders[0] * 0.5 + dVar10;
    uStack_b4 = (undefined4)((ulong)dVar11 >> 0x20);
    uStack_b0 = SUB84(dVar9,0);
    uStack_ac = (undefined4)((ulong)dVar9 >> 0x20);
    auVar4._4_8_ = uVar16;
    auVar4._0_4_ = uStack_b4;
    auVar15._0_8_ = auVar4._0_8_ << 0x20;
    auVar15._8_4_ = uStack_b0;
    auVar15._12_4_ = uStack_ac;
    local_48 = auVar15._8_8_;
    local_38 = (double)(local_60.wd.m_i.m_i * 2 - pQVar2->borders[3]);
    dStack_30 = (double)(local_60.ht.m_i.m_i * 2 - pQVar2->borders[0]);
    QPainterPath::arcTo((QRectF *)this,180.0,-90.0);
    QPainterPath::closeSubpath();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
LAB_00357e35:
  __stack_chk_fail();
}

Assistant:

QPainterPath QRenderRule::borderClip(QRect r)
{
    if (!hasBorder())
        return QPainterPath();

    QSize tlr, trr, blr, brr;
    qNormalizeRadii(r, bd->radii, &tlr, &trr, &blr, &brr);
    if (tlr.isNull() && trr.isNull() && blr.isNull() && brr.isNull())
        return QPainterPath();

    const QRectF rect(r);
    const int *borders = border()->borders;
    QPainterPath path;
    qreal curY = rect.y() + borders[TopEdge]/2.0;
    path.moveTo(rect.x() + tlr.width(), curY);
    path.lineTo(rect.right() - trr.width(), curY);
    qreal curX = rect.right() - borders[RightEdge]/2.0;
    path.arcTo(curX - 2*trr.width() + borders[RightEdge], curY,
               trr.width()*2 - borders[RightEdge], trr.height()*2 - borders[TopEdge], 90, -90);

    path.lineTo(curX, rect.bottom() - brr.height());
    curY = rect.bottom() - borders[BottomEdge]/2.0;
    path.arcTo(curX - 2*brr.width() + borders[RightEdge], curY - 2*brr.height() + borders[BottomEdge],
               brr.width()*2 - borders[RightEdge], brr.height()*2 - borders[BottomEdge], 0, -90);

    path.lineTo(rect.x() + blr.width(), curY);
    curX = rect.left() + borders[LeftEdge]/2.0;
    path.arcTo(curX, rect.bottom() - 2*blr.height() + borders[BottomEdge]/2.0,
               blr.width()*2 - borders[LeftEdge], blr.height()*2 - borders[BottomEdge], 270, -90);

    path.lineTo(curX, rect.top() + tlr.height());
    path.arcTo(curX, rect.top() + borders[TopEdge]/2.0,
               tlr.width()*2 - borders[LeftEdge], tlr.height()*2 - borders[TopEdge], 180, -90);

    path.closeSubpath();
    return path;
}